

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_commodities.cpp
# Opt level: O2

void __thiscall
commodities_unusual2string_Test::~commodities_unusual2string_Test
          (commodities_unusual2string_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(commodities, unusual2string)
{
    precise_unit com(1.0, precise::kg.inv(), getCommodity("happy'u"));
    auto str = to_string(com);
    EXPECT_EQ(unit_from_string(str), com);

    precise_unit com2(12.0, precise::kg.pow(-2), getCommodity("happy'u"));
    str = to_string(com2);
    EXPECT_EQ(unit_from_string(str), com2);

    precise_unit cominv = com.inv();
    str = to_string(cominv);
    EXPECT_EQ(unit_from_string(str), cominv);

    precise_unit com2inv(
        12.0, precise::m.pow(-2) * precise::kg, getCommodity("happy'u"));
    com2inv = com2inv.inv();
    str = to_string(com2inv);
    EXPECT_EQ(unit_from_string(str), com2inv);
}